

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strispassword_s.c
# Opt level: O0

_Bool strispassword_s(char *dest,rsize_t dmax)

{
  long lVar1;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint32_t cnt_specials;
  uint32_t cnt_numbers;
  uint32_t cnt_uppercase;
  uint32_t cnt_lowercase;
  uint32_t cnt_all;
  errno_t in_stack_ffffffffffffffcc;
  int error;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar5;
  ulong local_20;
  char *local_18;
  _Bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    local_9 = false;
  }
  else if (in_RSI < 6) {
    invoke_safe_str_constraint_handler
              ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    local_9 = false;
  }
  else if (in_RSI < 0x21) {
    if (*in_RDI == '\0') {
      local_9 = false;
    }
    else {
      uVar3 = 0;
      uVar4 = 0;
      uVar5 = 0;
      error = 0;
      iVar2 = 0;
      local_20 = in_RSI;
      for (local_18 = in_RDI; *local_18 != '\0'; local_18 = local_18 + 1) {
        if (local_20 == 0) {
          invoke_safe_str_constraint_handler
                    ((char *)CONCAT44(uVar5,uVar4),(void *)CONCAT44(uVar3,iVar2),error);
          local_9 = false;
          goto LAB_0010ad4c;
        }
        local_20 = local_20 - 1;
        uVar5 = uVar5 + 1;
        if ((*local_18 < '0') || ('9' < *local_18)) {
          if ((*local_18 < 'a') || ('z' < *local_18)) {
            if ((*local_18 < 'A') || ('Z' < *local_18)) {
              if ((((*local_18 < '!') || ('/' < *local_18)) &&
                  ((((*local_18 < ':' || ('@' < *local_18)) &&
                    ((*local_18 < '[' || ('^' < *local_18)))) &&
                   ((*local_18 < '_' || ('`' < *local_18)))))) &&
                 ((*local_18 < '{' || ('~' < *local_18)))) {
                local_9 = false;
                goto LAB_0010ad4c;
              }
              error = error + 1;
            }
            else {
              uVar3 = uVar3 + 1;
            }
          }
          else {
            uVar4 = uVar4 + 1;
          }
        }
        else {
          iVar2 = iVar2 + 1;
        }
      }
      if ((((uVar5 < 0x20) && (iVar2 != 0)) && (1 < uVar4)) && ((1 < uVar3 && (error != 0)))) {
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
  }
  else {
    invoke_safe_str_constraint_handler
              ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    local_9 = false;
  }
LAB_0010ad4c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool
strispassword_s (const char *dest, rsize_t dmax)
{
    uint32_t cnt_all;
    uint32_t cnt_lowercase;
    uint32_t cnt_uppercase;
    uint32_t cnt_numbers;
    uint32_t cnt_specials;

    if (!dest) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax < SAFE_STR_PASSWORD_MIN_LENGTH) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest is too short",
                   NULL, ESLEMIN);
        return (false);
    }

    if (dmax > SAFE_STR_PASSWORD_MAX_LENGTH) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    cnt_all = cnt_lowercase = cnt_uppercase = 0;
    cnt_numbers = cnt_specials = 0;

    while (*dest) {

        if (dmax == 0) {
            invoke_safe_str_constraint_handler(
                      "strispassword_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (false);
        }
        dmax--;

        cnt_all++;

        if ((*dest >= '0') && (*dest <= '9')) {
            cnt_numbers++;

        } else if ((*dest >= 'a') && (*dest <= 'z')) {
            cnt_lowercase++;

        } else if ((*dest >= 'A') && (*dest <= 'Z')) {
            cnt_uppercase++;

        /* allow all specials */
        } else if ((*dest >= 33) && (*dest <= 47)) {
            cnt_specials++;
        } else if ((*dest >= 58) && (*dest <= 64)) {
            cnt_specials++;
        } else if ((*dest >= 91) && (*dest <= 94)) {
            cnt_specials++;
        } else if ((*dest >= 95) && (*dest <= 96)) {
            cnt_specials++;
        } else if ((*dest >= 123) && (*dest <= 126)) {
            cnt_specials++;

        } else {
            /* illegal char in password string */
            return (false);
        }
        dest++;
    }

    if (cnt_all < SAFE_STR_PASSWORD_MAX_LENGTH &&
        cnt_numbers >=  SAFE_STR_MIN_NUMBERS &&
        cnt_lowercase >= SAFE_STR_MIN_LOWERCASE &&
        cnt_uppercase >= SAFE_STR_MIN_UPPERCASE &&
        cnt_specials >= SAFE_STR_MIN_SPECIALS ) {
        return (true);
    } else {
        return (false);
    }
}